

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O3

int __thiscall
ON_Viewport::GetBoundingBoxDepth
          (ON_Viewport *this,ON_BoundingBox bbox,ON_Xform *bbox_xform,double *near_dist,
          double *far_dist,bool bGrowNearFar)

{
  bool bVar1;
  double dVar2;
  ON_3dPoint P;
  ON_3dPoint P_00;
  ON_3dVector N;
  double *pdVar3;
  double *pdVar4;
  ON_3dVector *v_00;
  bool bVar5;
  ulong uVar6;
  ON_3dPoint *pOVar7;
  ON_Viewport *pOVar8;
  ON_3dPoint *pOVar9;
  char cVar10;
  uint uVar11;
  long lVar12;
  ON_PlaneEquation *this_00;
  undefined1 *puVar13;
  undefined7 in_register_00000081;
  ON_Line *line;
  uint uVar14;
  view_projection vVar15;
  uint uVar16;
  long lVar17;
  uint uVar18;
  long lVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar22;
  double t [2];
  double Lbuffer [24];
  double Sbuffer [20];
  double v [4] [8];
  double Pbuffer [216];
  ulong local_a50;
  ON_Interval local_a48;
  undefined1 *local_a38;
  ulong local_a30;
  ON_Viewport *local_a28;
  undefined4 local_a20;
  view_projection local_a1c;
  ON_3dPoint *local_a18;
  ON_3dPoint local_a10;
  undefined4 local_9f8;
  uint uStack_9f4;
  undefined4 uStack_9f0;
  uint uStack_9ec;
  double *local_9e8;
  double *local_9e0;
  undefined1 local_9d8 [16];
  ON_3dVector *local_9c8;
  ON_Xform *local_9c0;
  double local_9b8;
  double dStack_9b0;
  double local_9a8;
  ON_3dPoint local_9a0;
  ON_Line local_988;
  ON_3dPoint local_958;
  ON_3dPoint local_940;
  ON_3dPoint local_928;
  ON_3dPoint local_910;
  ON_3dPoint local_8f8;
  ON_3dPoint local_8e0;
  ON_PlaneEquation local_8c8;
  ON_PlaneEquation local_8a8;
  ON_PlaneEquation local_888;
  ON_PlaneEquation local_868;
  ON_PlaneEquation local_848;
  ON_3dPoint local_828;
  ON_3dVector local_810;
  undefined1 auStack_7f8 [64];
  double adStack_7b8 [8];
  double adStack_778 [8];
  double adStack_738 [8];
  ON_3dPoint local_6f8 [8];
  ON_3dPoint local_638;
  ON_3dPoint local_620 [63];
  
  local_a18 = &this->m_CamLoc;
  local_9e0 = near_dist;
  dVar22 = ON_3dPoint::MaximumCoordinate(local_a18);
  local_9d8._8_4_ = extraout_XMM0_Dc;
  local_9d8._0_8_ = dVar22;
  local_9d8._12_4_ = extraout_XMM0_Dd;
  local_a1c = this->m_projection;
  pOVar7 = local_6f8;
  local_a28 = this;
  bVar5 = ON_BoundingBox::GetCorners(&bbox,pOVar7);
  if (!bVar5) {
    return 0;
  }
  if ((bbox_xform != (ON_Xform *)0x0) && (bVar5 = ON_Xform::IsValid(bbox_xform), !bVar5)) {
    return 0;
  }
  pOVar8 = local_a28;
  local_9c0 = bbox_xform;
  bVar5 = GetFrustumLeftPlaneEquation(local_a28,&local_8c8);
  if (!bVar5) {
    return 0;
  }
  bVar5 = GetFrustumRightPlaneEquation(pOVar8,&local_8a8);
  if (!bVar5) {
    return 0;
  }
  bVar5 = GetFrustumBottomPlaneEquation(pOVar8,&local_888);
  if (!bVar5) {
    return 0;
  }
  bVar5 = GetFrustumTopPlaneEquation(pOVar8,&local_868);
  if (!bVar5) {
    return 0;
  }
  local_a20 = (undefined4)CONCAT71(in_register_00000081,bGrowNearFar);
  uVar20 = local_9d8._12_4_;
  local_9d8._8_4_ = local_9d8._8_4_;
  local_9d8._0_8_ = (local_9d8._0_8_ + 1.0) * 1.490116119385e-08;
  local_9d8._12_4_ = uVar20;
  local_9a8 = local_a18->z;
  local_9b8 = local_a18->x;
  dStack_9b0 = local_a18->y;
  local_9c8 = &pOVar8->m_CamZ;
  local_9e8 = far_dist;
  ON_3dVector::operator-(&local_810,local_9c8);
  P.y = dStack_9b0;
  P.x = local_9b8;
  P.z = local_9a8;
  N.y = local_810.y;
  N.x = local_810.x;
  N.z = local_810.z;
  ON_PlaneEquation::Create(&local_848,P,N);
  uStack_9f4 = local_9d8._4_4_ ^ 0x80000000;
  uStack_9ec = local_9d8._12_4_ ^ 0x80000000;
  uStack_9f0 = local_9d8._8_4_;
  local_9f8 = local_9d8._0_4_;
  local_a30 = 0;
  lVar12 = -8;
  uVar18 = 0;
  uVar16 = 0;
  do {
    local_a38 = (undefined1 *)CONCAT44(local_a38._4_4_,uVar16);
    if (local_9c0 != (ON_Xform *)0x0) {
      ON_Xform::operator*(&local_988.from,local_9c0,pOVar7);
      pOVar7->z = local_988.from.z;
      pOVar7->x = local_988.from.x;
      pOVar7->y = local_988.from.y;
    }
    dVar22 = ON_PlaneEquation::ValueAt(&local_8c8,*pOVar7);
    bVar5 = dVar22 < (double)CONCAT44(uStack_9f4,local_9f8);
    adStack_7b8[lVar12] = dVar22;
    bVar1 = !bVar5;
    uVar18 = uVar18 | bVar5;
    dVar22 = ON_PlaneEquation::ValueAt(&local_8a8,*pOVar7);
    adStack_778[lVar12] = dVar22;
    uVar11 = uVar18 | 2;
    uVar16 = (uint)bVar1;
    if ((double)CONCAT44(uStack_9f4,local_9f8) <= dVar22) {
      uVar11 = uVar18;
      uVar16 = bVar1 + 2;
    }
    dVar22 = ON_PlaneEquation::ValueAt(&local_888,*pOVar7);
    adStack_738[lVar12] = dVar22;
    uVar14 = uVar11 | 4;
    if ((double)CONCAT44(uStack_9f4,local_9f8) <= dVar22) {
      uVar14 = uVar11;
      uVar16 = uVar16 + 4;
    }
    dVar22 = ON_PlaneEquation::ValueAt(&local_868,*pOVar7);
    vVar15 = local_a1c;
    uVar18 = uVar14 | 8;
    if ((double)CONCAT44(uStack_9f4,local_9f8) <= dVar22) {
      uVar18 = uVar14;
      uVar16 = uVar16 + 8;
    }
    (&local_6f8[0].x)[lVar12] = dVar22;
    if (((local_a1c != perspective_view) ||
        (dVar22 = ON_PlaneEquation::ValueAt(&local_848,*pOVar7), 0.0 < dVar22)) &&
       (uVar16 = uVar16 | 0x10, uVar16 == 0x1f)) {
      uVar6 = local_a30 & 0xffffffff;
      local_a30 = (ulong)((int)local_a30 + 1);
      local_620[uVar6 - 1].z = pOVar7->z;
      dVar22 = pOVar7->y;
      (&local_638)[uVar6].x = pOVar7->x;
      local_620[uVar6 - 1].y = dVar22;
      uVar16 = 0x1f;
    }
    pOVar9 = local_a18;
    pOVar8 = local_a28;
    line = &local_988;
    uVar16 = (uint)local_a38 | uVar16;
    pOVar7 = pOVar7 + 1;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 0);
  uVar11 = (uint)local_a30;
  if (uVar11 < 8) {
    if (uVar16 != 0x1f) {
      return 0;
    }
    if (vVar15 == perspective_view) {
      dVar22 = ON_BoundingBox::MinimumDistanceTo(&bbox,local_a18);
      local_a50 = local_a30;
      if (dVar22 <= 0.0) {
        local_a50 = (ulong)((int)local_a30 + 1);
        uVar6 = local_a30 & 0xffffffff;
        local_620[uVar6 - 1].z = pOVar9->z;
        dVar2 = pOVar9->y;
        (&local_638)[uVar6].x = pOVar9->x;
        local_620[uVar6 - 1].y = dVar2;
      }
      uVar16 = (uint)(dVar22 <= 0.0);
      local_988.from.z = pOVar9->z;
      local_988.from.x = pOVar9->x;
      local_988.from.y = pOVar9->y;
      local_958.z = pOVar9->z;
      local_958.x = pOVar9->x;
      local_958.y = pOVar9->y;
      local_928.x = pOVar9->x;
      local_928.y = pOVar9->y;
      local_928.z = pOVar9->z;
      local_8f8.x = pOVar9->x;
      local_8f8.y = pOVar9->y;
      local_8f8.z = pOVar9->z;
      pOVar8 = local_a28;
    }
    else {
      bVar5 = GetNearRect(local_a28,&local_988.from,&local_958,&local_928,&local_8f8);
      uVar16 = 0;
      local_a50 = local_a30;
      if (!bVar5) {
        return 0;
      }
    }
    bVar5 = GetFarRect(pOVar8,&local_988.to,&local_940,&local_910,&local_8e0);
    if (!bVar5) {
      return 0;
    }
    local_a28 = (ON_Viewport *)CONCAT44(local_a28._4_4_,uVar16);
    lVar12 = 0;
    local_a38 = (undefined1 *)CONCAT44(local_a38._4_4_,~uVar18);
    do {
      if ((*(uint *)((long)&DAT_006e9c10 + lVar12) & (uint)local_a38) == 0) {
        bVar5 = ON_Intersect(&bbox,line,(double)local_9d8._0_8_,&local_a48);
        if (bVar5) {
          uVar20 = SUB84(local_a48.m_t[0],0);
          uVar21 = (undefined4)((ulong)local_a48.m_t[0] >> 0x20);
          if (vVar15 == perspective_view) {
            if (local_a48.m_t[1] < 0.0) goto LAB_0066cd48;
            if (local_a48.m_t[0] < 0.0) {
              if ((int)local_a28 == 0) {
                uVar6 = local_a50 & 0xffffffff;
                local_a50 = (ulong)((int)local_a50 + 1);
                local_620[uVar6 - 1].z = local_a18->z;
                dVar22 = local_a18->y;
                (&local_638)[uVar6].x = local_a18->x;
                local_620[uVar6 - 1].y = dVar22;
              }
              local_a48.m_t[0] = local_a48.m_t[1];
              local_a28 = (ON_Viewport *)CONCAT44(local_a28._4_4_,1);
              uVar20 = SUB84(local_a48.m_t[1],0);
              uVar21 = (int)((ulong)local_a48.m_t[1] >> 0x20);
            }
          }
          ON_Line::PointAt(&local_a10,line,(double)CONCAT44(uVar21,uVar20));
          uVar16 = (int)local_a50 + 1;
          uVar6 = local_a50 & 0xffffffff;
          local_620[uVar6 - 1].z = local_a10.z;
          (&local_638)[uVar6].x = local_a10.x;
          local_620[uVar6 - 1].y = local_a10.y;
          if (local_a48.m_t[0] < local_a48.m_t[1]) {
            ON_Line::PointAt(&local_a10,line,local_a48.m_t[1]);
            local_620[(ulong)uVar16 - 1].z = local_a10.z;
            (&local_638)[uVar16].x = local_a10.x;
            local_620[(ulong)uVar16 - 1].y = local_a10.y;
            uVar16 = (int)local_a50 + 2;
          }
          local_a50 = (ulong)uVar16;
        }
      }
LAB_0066cd48:
      lVar12 = lVar12 + 4;
      line = line + 1;
    } while (lVar12 != 0x10);
    lVar12 = 0;
    do {
      puVar13 = auStack_7f8 + lVar12 * 0x40;
      lVar17 = 0;
      local_a38 = puVar13;
      do {
        uVar16 = (&DAT_006e9c34)[lVar17 * 2];
        dVar22 = *(double *)(puVar13 + (ulong)(uint)(&DAT_006e9c30)[lVar17 * 2] * 8);
        if (dVar22 * *(double *)(puVar13 + (ulong)uVar16 * 8) < 0.0) {
          dVar22 = dVar22 / (dVar22 - *(double *)(puVar13 + (ulong)uVar16 * 8));
          ::operator*(&local_9a0,1.0 - dVar22,local_6f8 + (uint)(&DAT_006e9c30)[lVar17 * 2]);
          ::operator*(&local_828,dVar22,local_6f8 + uVar16);
          ON_3dPoint::operator+(&local_a10,&local_9a0,&local_828);
          uVar6 = local_a50 & 0xffffffff;
          local_620[uVar6 - 1].z = local_a10.z;
          (&local_638)[uVar6].x = local_a10.x;
          local_620[uVar6 - 1].y = local_a10.y;
          this_00 = &local_8c8;
          lVar19 = 0;
          do {
            if ((lVar12 != lVar19) &&
               (P_00.y = local_a10.y, P_00.x = local_a10.x, P_00.z = local_a10.z,
               dVar22 = ON_PlaneEquation::ValueAt(this_00,P_00), puVar13 = local_a38,
               dVar22 <= (double)CONCAT44(uStack_9f4,local_9f8))) goto LAB_0066cec5;
            lVar19 = lVar19 + 1;
            this_00 = this_00 + 1;
          } while (lVar19 != 4);
          local_a50 = (ulong)((int)local_a50 + 1);
          puVar13 = local_a38;
        }
LAB_0066cec5:
        lVar17 = lVar17 + 1;
      } while (lVar17 != 0xc);
      lVar12 = lVar12 + 1;
    } while (lVar12 != 4);
    uVar11 = (uint)local_a50;
    vVar15 = local_a1c;
    if (uVar11 == 0) {
      return 0;
    }
  }
  pOVar7 = local_a18;
  ON_3dPoint::operator-((ON_3dVector *)&local_9a0,local_a18,&local_638);
  v_00 = local_9c8;
  local_a48.m_t[0] = ON_3dVector::operator*((ON_3dVector *)&local_9a0,local_9c8);
  uVar20 = SUB84(local_a48.m_t[0],0);
  uVar21 = (undefined4)((ulong)local_a48.m_t[0] >> 0x20);
  local_a48.m_t[1] = local_a48.m_t[0];
  if (1 < uVar11) {
    pOVar9 = local_620;
    lVar12 = (ulong)uVar11 - 1;
    do {
      ON_3dPoint::operator-((ON_3dVector *)&local_9a0,pOVar7,pOVar9);
      dVar22 = ON_3dVector::operator*((ON_3dVector *)&local_9a0,v_00);
      uVar20 = SUB84(dVar22,0);
      uVar21 = (undefined4)((ulong)dVar22 >> 0x20);
      if (local_a48.m_t[0] <= dVar22) {
        if (local_a48.m_t[1] < dVar22) {
          local_a48.m_t[1] = dVar22;
        }
        uVar20 = SUB84(local_a48.m_t[0],0);
        uVar21 = (undefined4)((ulong)local_a48.m_t[0] >> 0x20);
        dVar22 = local_a48.m_t[0];
      }
      local_a48.m_t[0] = dVar22;
      pOVar9 = pOVar9 + 1;
      lVar12 = lVar12 + -1;
    } while (lVar12 != 0);
  }
  pdVar4 = local_9e0;
  pdVar3 = local_9e8;
  if (vVar15 == perspective_view) {
    if (local_a48.m_t[1] < 0.0) {
      return 0;
    }
    if ((double)CONCAT44(uVar21,uVar20) <= 0.0 && (double)CONCAT44(uVar21,uVar20) != 0.0) {
      local_a48.m_t[0] = 0.0;
      uVar20 = 0;
      uVar21 = 0;
    }
  }
  cVar10 = (char)local_a20;
  if (local_9e0 == (double *)0x0) {
LAB_0066d001:
    if (pdVar3 == (double *)0x0) goto LAB_0066d045;
    if (cVar10 != '\0') goto LAB_0066d00b;
    uVar20 = SUB84(local_a48.m_t[1],0);
    uVar21 = (undefined4)((ulong)local_a48.m_t[1] >> 0x20);
  }
  else {
    if (cVar10 == '\0') {
LAB_0066cffc:
      *pdVar4 = (double)CONCAT44(uVar21,uVar20);
      goto LAB_0066d001;
    }
    bVar5 = ON_IsValid(*local_9e0);
    uVar20 = SUB84(local_a48.m_t[0],0);
    uVar21 = (undefined4)((ulong)local_a48.m_t[0] >> 0x20);
    if ((!bVar5) || (local_a48.m_t[0] < *pdVar4)) goto LAB_0066cffc;
    if (pdVar3 == (double *)0x0) goto LAB_0066d045;
LAB_0066d00b:
    bVar5 = ON_IsValid(*pdVar3);
    uVar20 = SUB84(local_a48.m_t[1],0);
    uVar21 = (undefined4)((ulong)local_a48.m_t[1] >> 0x20);
    if ((bVar5) && (local_a48.m_t[1] < *pdVar3 || local_a48.m_t[1] == *pdVar3)) goto LAB_0066d045;
  }
  *pdVar3 = (double)CONCAT44(uVar21,uVar20);
LAB_0066d045:
  return 2 - (uint)((uint)local_a30 < 8);
}

Assistant:

int ON_Viewport::GetBoundingBoxDepth(       
       ON_BoundingBox bbox,
       const ON_Xform* bbox_xform,
       double* near_dist,
       double* far_dist,
       bool bGrowNearFar
       ) const
{
  // The Xbuffer[] stuff is to skip wasting time in unneeded constructors.
  // The buffers are double arrays to insure alignments are correct.
  ON_3dPoint* C;
  ON_3dPoint* P;
  ON_PlaneEquation* S;
  ON_Line* L;
  ON_3dPoint Q;
  double Pbuffer[(8+8+8+48)*(sizeof(P[0])/sizeof(double))];
  double Sbuffer[5*(sizeof(S[0])/sizeof(double))];
  double Lbuffer[4*(sizeof(L[0])/sizeof(double))];
  double d, t[2], v[4][8], v0, v1;
  const double tol = ON_SQRT_EPSILON*(1.0 + m_CamLoc.MaximumCoordinate());
  C = (ON_3dPoint*)Pbuffer;
  P = C+8;
  S = (ON_PlaneEquation*)Sbuffer;
  L = (ON_Line*)Lbuffer;
  unsigned int i, j, k, Pin, Pout, Pcount;
  bool rc;
  bool bTrimmed = false;
  const bool bPerspectiveProjection = (ON::perspective_view == m_projection);

  for (;;)
  {
    rc = bbox.GetCorners(C);
    if (!rc)
      break;
    
    if (nullptr != bbox_xform)
    {
      rc = bbox_xform->IsValid();
      if (!rc)
        break;
    }

    rc = GetFrustumLeftPlaneEquation(S[0]);
    if (!rc)
      break;
    rc = GetFrustumRightPlaneEquation(S[1]);
    if (!rc)
      break;
    rc = GetFrustumBottomPlaneEquation(S[2]);
    if (!rc)
      break;
    rc = GetFrustumTopPlaneEquation(S[3]);
    if (!rc)
      break;

    S[4].Create(m_CamLoc,-m_CamZ);
    
    Pcount = 0;
    Pin = 0;
    Pout = 0;

    for ( i = 0; i < 8; i++ )
    {
      if ( nullptr != bbox_xform )
        C[i] = (*bbox_xform)*C[i];

      k = 0;
      if ( (v[0][i] = S[0].ValueAt(C[i])) >= -tol )
        k |= 1;      
      else
        Pout |= 1;
      if ( (v[1][i] = S[1].ValueAt(C[i])) >= -tol )
        k |= 2;
      else
        Pout |= 2;
      if ( (v[2][i] = S[2].ValueAt(C[i])) >= -tol )
        k |= 4;
      else
        Pout |= 4;
      if ( (v[3][i] = S[3].ValueAt(C[i])) >= -tol )
        k |= 8;
      else
        Pout |= 8;

      if ( !bPerspectiveProjection || S[4].ValueAt(C[i]) > 0.0 )
        k |= 16;

      Pin |= k;
      if ( (1|2|4|8|16) == k )
      {
        // C[i] is inside the infinite frustum
        P[Pcount++] = C[i];
      }
    }

    if ( Pcount < 8 )
    {
      bTrimmed = true;
      // some portion of bbox is outside the infinite frustum
      if ( (1|2|4|8|16) != Pin )
      {
        // bbox does not intersect the infinite frustum.
        rc = false;
        break;
      }

      j = 0;
      if ( bPerspectiveProjection )
      {
        if ( bbox.MinimumDistanceTo(m_CamLoc) <= 0.0 )
        {
          // camera location is in the bounding box
          P[Pcount++] = m_CamLoc;
          j = 1; // j = 1 indicates m_CamLoc has been added to P[].
        }
        L[0].from = m_CamLoc;
        L[1].from = m_CamLoc;
        L[2].from = m_CamLoc;
        L[3].from = m_CamLoc;
      }
      else
      {
        rc = GetNearRect(L[0].from,L[1].from,L[2].from,L[3].from);
        if (!rc)
          break;
      }

      rc = GetFarRect(L[0].to,L[1].to,L[2].to,L[3].to);
      if (!rc)
        break;

      const unsigned int Linout[4] = {
        1|4, // intersection of left and bottom frustum sides
        2|4, // intersection of right and bottom frustum sides
        1|8, // intersection of left and top frustum sides
        2|8  // intersection of right and top frustum sides
        };

      k = Pin & Pout;
      for ( i = 0; i < 4; i++ )
      {
        // The Linout[i] == ... test is true if bbox is on both sides
        // of both planes whose intersection defines the line L[i].
        // The fast integer test helps cull unnecessary calls to
        // the expensive ON_Intersect() function.
        if (    Linout[i] == (k & Linout[i]) 
             && ON_Intersect(bbox,L[i],tol,(ON_Interval*)t) 
           )
        {
          if ( bPerspectiveProjection )
          {
            if ( t[1] < 0.0 )
              continue;
            if ( t[0] < 0.0 )
            {
              if ( 0 == j )
              {
                P[Pcount++] = m_CamLoc;
                j = 1; // j = 1 indicates m_CamLoc has been added to P[].
              }
              t[0] = t[1];
            }
          }
          P[Pcount++] = L[i].PointAt(t[0]);
          if ( t[1] > t[0] )
            P[Pcount++] = L[i].PointAt(t[1]);
        }
      }

      // intersect box edges with frustum sides
      // The 12 bbox edges have endpoints
      // C[e[*][0]] and C[E[*][1]]
      const unsigned int e[12][2] = {
        {0,1},{2,3},{4,5},{6,7},
        {0,2},{1,3},{4,6},{5,7},
        {0,4},{1,5},{2,6},{3,7}};

      for ( i = 0; i < 4; i++ )
      {
        for ( j = 0; j < 12; j++ )
        {
          v0 = v[i][e[j][0]];
          v1 = v[i][e[j][1]];
          if ( v0*v1 < 0.0 )
          {
            // this box edge crosses the frustum side plane
            d = v0/(v0-v1);
            P[Pcount++] = Q = (1.0-d)*C[e[j][0]] + d*C[e[j][1]];
            // verify that Q is in the frustum
            for ( k = 0; k < 4; k++ )
            {
              if ( i != k && S[k].ValueAt(Q) <= -tol )
              {
                // Q is not in the view frustum
                Pcount--;
                break;
              }
            }
          }
        }
      }
      if ( 0 == Pcount )
      {
        rc = false;
        break;
      }
    }

    t[0] = t[1] = (m_CamLoc - P[0])*m_CamZ;
    for ( i = 1; i < Pcount; i++ )
    {
      d = (m_CamLoc - P[i])*m_CamZ;
      if ( d < t[0] )
        t[0] = d;
      else if ( d > t[1] )
        t[1] = d;
    }

    if ( bPerspectiveProjection )
    {
      if ( t[1] < 0.0 )
      {
        rc = false;
        break;
      }
      if ( t[0] < 0.0 )
        t[0] = 0.0;
    }

    if ( 0 != near_dist && (!bGrowNearFar || !ON_IsValid(*near_dist) || t[0] < *near_dist) )
      *near_dist = t[0];
    if ( 0 != far_dist && (!bGrowNearFar || !ON_IsValid(*far_dist) || t[1] > *far_dist) )
      *far_dist = t[1];

    rc = true;
    break;
  }

  // 0 = out, 1 = partially in infinite frustum, 2 = all in infinite frustum
  return (rc) ? (bTrimmed ? 1 : 2) : 0;
}